

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O2

void lj_dispatch_update(global_State *g)

{
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  long lVar5;
  code *pcVar6;
  code *pcVar7;
  code *pcVar8;
  code *pcVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  bVar1 = g->dispatchmode;
  uVar12 = g[1].strempty.hash & 1;
  uVar4 = 0xe;
  if (g[1].uvhead.field_5.field_1.next.gcptr32 == 0) {
    uVar4 = 0;
  }
  uVar2 = (uint)((g->hookmask & 0xc) != 0);
  uVar11 = (uint)g->hookmask << 3;
  uVar10 = uVar11 & 0x18 | uVar2 << 2 | uVar4 | uVar12;
  if (uVar10 == bVar1) {
    return;
  }
  g->dispatchmode = (uint8_t)uVar10;
  if ((uVar4 & 3 | uVar12) == 1) {
    pcVar9 = lj_BC_FUNCF;
    pcVar6 = lj_BC_LOOP;
    pcVar7 = lj_BC_ITERL;
    pcVar8 = lj_BC_FORL;
  }
  else {
    pcVar8 = *(code **)(g[0xb].gcroot + 0x1a);
    pcVar7 = *(code **)(g[0xb].gcroot + 0x20);
    pcVar6 = (code *)g[0xc].strhash;
    pcVar9 = lj_BC_IFUNCF;
  }
  *(code **)(g[0xb].gcroot + 0x18) = pcVar8;
  *(code **)(g[0xb].gcroot + 0x1e) = pcVar7;
  *(code **)(g[0xb].gcroot + 0x24) = pcVar6;
  uVar13 = uVar10 ^ bVar1;
  if ((uVar13 & 6) == 0) {
    if (uVar2 == 0 && (uVar4 & 6) == 0) {
      *(code **)(g[8].gcroot + 0x14) = pcVar8;
      *(code **)(g[8].gcroot + 0x1a) = pcVar7;
      *(code **)(g[8].gcroot + 0x20) = pcVar6;
      if ((uVar11 & 0x10) != 0) goto LAB_0010cd4c;
      uVar3 = *(undefined8 *)(g[0xb].gcroot + 0xe);
      *(undefined8 *)(g[8].gcroot + 8) = *(undefined8 *)(g[0xb].gcroot + 0xc);
      *(undefined8 *)(g[8].gcroot + 10) = uVar3;
      *(undefined8 *)(g[8].gcroot + 0xc) = *(undefined8 *)(g[0xb].gcroot + 0x10);
      pcVar8 = *(code **)(g[0xb].gcroot + 0x12);
LAB_0010cd68:
      *(code **)(g[8].gcroot + 0xe) = pcVar8;
    }
  }
  else if (uVar2 == 0 && (uVar4 & 6) == 0) {
    memcpy(&g[7].stremptyz,&g[10].tmptv,0x2a8);
    if ((uVar11 & 0x10) != 0) {
LAB_0010cd4c:
      pcVar8 = lj_vm_rethook;
      *(code **)(g[8].gcroot + 8) = lj_vm_rethook;
      *(code **)(g[8].gcroot + 10) = lj_vm_rethook;
      *(code **)(g[8].gcroot + 0xc) = lj_vm_rethook;
      goto LAB_0010cd68;
    }
  }
  else {
    pcVar8 = lj_vm_record;
    if ((uVar4 & 2) == 0) {
      pcVar8 = lj_vm_inshook;
    }
    for (lVar5 = 0; lVar5 != 0x55; lVar5 = lVar5 + 1) {
      *(code **)(&g[7].stremptyz + lVar5 * 8) = pcVar8;
    }
  }
  if ((uVar13 & 8) == 0) {
    if ((uVar10 & 8) != 0) goto LAB_0010cd90;
  }
  else {
    lVar5 = 0;
    if ((uVar10 & 8) != 0) {
      for (; lVar5 != 0x46; lVar5 = lVar5 + 1) {
        *(code **)(&g[9].strmask + lVar5 * 2) = lj_vm_callhook;
      }
      goto LAB_0010cd90;
    }
    for (; lVar5 != 0x46; lVar5 = lVar5 + 1) {
      *(code **)(&g[9].strmask + lVar5 * 2) = lj_BC_ISLT + lj_bc_ofs[lVar5 + 0x55];
    }
  }
  *(code **)&g[9].strmask = pcVar9;
  *(code **)&g[9].gc = lj_BC_IFUNCV;
LAB_0010cd90:
  if ((bVar1 & 1) != 0 || uVar12 == 0) {
    return;
  }
  lj_dispatch_init_hotcount(g);
  return;
}

Assistant:

void lj_dispatch_update(global_State *g)
{
  uint8_t oldmode = g->dispatchmode;
  uint8_t mode = 0;
#if LJ_HASJIT
  mode |= (G2J(g)->flags & JIT_F_ON) ? DISPMODE_JIT : 0;
  mode |= G2J(g)->state != LJ_TRACE_IDLE ?
	    (DISPMODE_REC|DISPMODE_INS|DISPMODE_CALL) : 0;
#endif
  mode |= (g->hookmask & (LUA_MASKLINE|LUA_MASKCOUNT)) ? DISPMODE_INS : 0;
  mode |= (g->hookmask & LUA_MASKCALL) ? DISPMODE_CALL : 0;
  mode |= (g->hookmask & LUA_MASKRET) ? DISPMODE_RET : 0;
  if (oldmode != mode) {  /* Mode changed? */
    ASMFunction *disp = G2GG(g)->dispatch;
    ASMFunction f_forl, f_iterl, f_loop, f_funcf, f_funcv;
    g->dispatchmode = mode;

    /* Hotcount if JIT is on, but not while recording. */
    if ((mode & (DISPMODE_JIT|DISPMODE_REC)) == DISPMODE_JIT) {
      f_forl = makeasmfunc(lj_bc_ofs[BC_FORL]);
      f_iterl = makeasmfunc(lj_bc_ofs[BC_ITERL]);
      f_loop = makeasmfunc(lj_bc_ofs[BC_LOOP]);
      f_funcf = makeasmfunc(lj_bc_ofs[BC_FUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_FUNCV]);
    } else {  /* Otherwise use the non-hotcounting instructions. */
      f_forl = disp[GG_LEN_DDISP+BC_IFORL];
      f_iterl = disp[GG_LEN_DDISP+BC_IITERL];
      f_loop = disp[GG_LEN_DDISP+BC_ILOOP];
      f_funcf = makeasmfunc(lj_bc_ofs[BC_IFUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_IFUNCV]);
    }
    /* Init static counting instruction dispatch first (may be copied below). */
    disp[GG_LEN_DDISP+BC_FORL] = f_forl;
    disp[GG_LEN_DDISP+BC_ITERL] = f_iterl;
    disp[GG_LEN_DDISP+BC_LOOP] = f_loop;

    /* Set dynamic instruction dispatch. */
    if ((oldmode ^ mode) & (DISPMODE_REC|DISPMODE_INS)) {
      /* Need to update the whole table. */
      if (!(mode & (DISPMODE_REC|DISPMODE_INS))) {  /* No ins dispatch? */
	/* Copy static dispatch table to dynamic dispatch table. */
	memcpy(&disp[0], &disp[GG_LEN_DDISP], GG_LEN_SDISP*sizeof(ASMFunction));
	/* Overwrite with dynamic return dispatch. */
	if ((mode & DISPMODE_RET)) {
	  disp[BC_RETM] = lj_vm_rethook;
	  disp[BC_RET] = lj_vm_rethook;
	  disp[BC_RET0] = lj_vm_rethook;
	  disp[BC_RET1] = lj_vm_rethook;
	}
      } else {
	/* The recording dispatch also checks for hooks. */
	ASMFunction f = (mode & DISPMODE_REC) ? lj_vm_record : lj_vm_inshook;
	uint32_t i;
	for (i = 0; i < GG_LEN_SDISP; i++)
	  disp[i] = f;
      }
    } else if (!(mode & (DISPMODE_REC|DISPMODE_INS))) {
      /* Otherwise set dynamic counting ins. */
      disp[BC_FORL] = f_forl;
      disp[BC_ITERL] = f_iterl;
      disp[BC_LOOP] = f_loop;
      /* Set dynamic return dispatch. */
      if ((mode & DISPMODE_RET)) {
	disp[BC_RETM] = lj_vm_rethook;
	disp[BC_RET] = lj_vm_rethook;
	disp[BC_RET0] = lj_vm_rethook;
	disp[BC_RET1] = lj_vm_rethook;
      } else {
	disp[BC_RETM] = disp[GG_LEN_DDISP+BC_RETM];
	disp[BC_RET] = disp[GG_LEN_DDISP+BC_RET];
	disp[BC_RET0] = disp[GG_LEN_DDISP+BC_RET0];
	disp[BC_RET1] = disp[GG_LEN_DDISP+BC_RET1];
      }
    }

    /* Set dynamic call dispatch. */
    if ((oldmode ^ mode) & DISPMODE_CALL) {  /* Update the whole table? */
      uint32_t i;
      if ((mode & DISPMODE_CALL) == 0) {  /* No call hooks? */
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = makeasmfunc(lj_bc_ofs[i]);
      } else {
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = lj_vm_callhook;
      }
    }
    if (!(mode & DISPMODE_CALL)) {  /* Overwrite dynamic counting ins. */
      disp[BC_FUNCF] = f_funcf;
      disp[BC_FUNCV] = f_funcv;
    }

#if LJ_HASJIT
    /* Reset hotcounts for JIT off to on transition. */
    if ((mode & DISPMODE_JIT) && !(oldmode & DISPMODE_JIT))
      lj_dispatch_init_hotcount(g);
#endif
  }
}